

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  size_t *psVar1;
  pointer puVar2;
  pointer puVar3;
  BodyExpr *pBVar4;
  size_t sVar5;
  Token *pTVar6;
  size_t sVar7;
  size_t sVar8;
  Lexer *pLVar9;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *plVar10;
  bool bVar11;
  _List_node_base *p_Var12;
  pointer __p;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  _Head_base<0UL,_pfederc::FuncExpr_*,_false> local_88;
  Position local_80;
  Lexer *local_68;
  Error<pfederc::SyntaxErrorCode> *local_60;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *local_58;
  undefined1 local_48 [16];
  
  local_58 = functions;
  bVar11 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
  if (bVar11) {
    do {
      bVar11 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if (!bVar11) {
        return;
      }
      bVar11 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar11) {
        Lexer::next(this->lexer);
      }
      else {
        parseExpression((Parser *)&local_68,(Precedence)this);
        pLVar9 = local_68;
        if (local_68 != (Lexer *)0x0) {
          if (*(ExprType *)&(local_68->filePath)._M_dataplus._M_p == EXPR_FUNC) {
            local_68 = (Lexer *)0x0;
            local_88._M_head_impl = (FuncExpr *)pLVar9;
            puVar2 = (pointer)(pLVar9->fileContent).field_2._M_allocated_capacity;
            puVar3 = *(pointer *)((long)&(pLVar9->fileContent).field_2 + 8);
            if (puVar2 != puVar3) {
              Position::operator+(&local_80,
                                  (Position *)
                                  ((long)(((puVar2->_M_t).
                                           super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
                                           .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>.
                                          _M_head_impl)->id)._M_t + 0x20),
                                  (Position *)
                                  ((long)((puVar3[-1]._M_t.
                                           super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
                                           .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>.
                                          _M_head_impl)->expr)._M_t.
                                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                  + 0x20));
              local_60 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
              local_60->logLevel = LVL_ERROR;
              local_60->err = STX_ERR_TRAIT_SCOPE_FUNC_TEMPL;
              (local_60->pos).line = local_80.line;
              (local_60->pos).startIndex = local_80.startIndex;
              (local_60->pos).endIndex = local_80.endIndex;
              (local_60->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (local_60->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_60->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              generateError((Parser *)&stack0xffffffffffffffc8,
                            (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
              std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>
                           *)&stack0xffffffffffffffc8);
              if (local_60 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_60,
                           local_60);
              }
            }
            pBVar4 = ((local_88._M_head_impl)->body)._M_t.
                     super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                     .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
            if (pBVar4 != (BodyExpr *)0x0) {
              local_80.line = (size_t)operator_new(0x38);
              sVar7 = (pBVar4->super_Expr).pos.line;
              sVar8 = *(size_t *)((long)&(pBVar4->super_Expr).pos + 8);
              sVar5 = *(size_t *)((long)&(pBVar4->super_Expr).pos + 0x10);
              ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->logLevel = LVL_ERROR;
              ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->err =
                   STX_ERR_TRAIT_SCOPE_FUNC_BODY;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).line = sVar7;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).startIndex = sVar8;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).endIndex = sVar5;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              generateError((Parser *)(local_48 + 8),
                            (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
              std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>
                           *)(local_48 + 8));
              if ((Error<pfederc::SyntaxErrorCode> *)local_80.line !=
                  (Error<pfederc::SyntaxErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_80,
                           (Error<pfederc::SyntaxErrorCode> *)local_80.line);
              }
            }
            p_Var12 = (_List_node_base *)operator_new(0x18);
            plVar10 = local_58;
            p_Var12[1]._M_next = (_List_node_base *)local_88._M_head_impl;
            local_88._M_head_impl = (FuncExpr *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var12);
            psVar1 = &(plVar10->
                      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                       &local_88);
          }
          else if (local_68 != (Lexer *)0x0) {
            local_80.line = (size_t)operator_new(0x38);
            sVar7 = ((Position *)&(pLVar9->filePath)._M_string_length)->line;
            sVar8 = (pLVar9->filePath).field_2._M_allocated_capacity;
            sVar5 = *(size_t *)((long)&(pLVar9->filePath).field_2 + 8);
            ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->logLevel = LVL_ERROR;
            ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->err = STX_ERR_TRAIT_SCOPE;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).line = sVar7;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).startIndex = sVar8;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).endIndex = sVar5;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            generateError((Parser *)local_48,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        local_48);
            if ((Error<pfederc::SyntaxErrorCode> *)local_80.line !=
                (Error<pfederc::SyntaxErrorCode> *)0x0) {
              std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_80,
                         (Error<pfederc::SyntaxErrorCode> *)local_80.line);
            }
          }
        }
        bVar11 = expect(this,TOK_EOL);
        if (!bVar11) {
          pTVar6 = this->lexer->currentToken;
          local_80.line = (size_t)operator_new(0x38);
          sVar7 = (pTVar6->pos).line;
          sVar8 = (pTVar6->pos).startIndex;
          sVar5 = (pTVar6->pos).endIndex;
          ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->logLevel = LVL_ERROR;
          ((Error<pfederc::SyntaxErrorCode> *)local_80.line)->err = STX_ERR_EXPECTED_EOL;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).line = sVar7;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).startIndex = sVar8;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->pos).endIndex = sVar5;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (((Error<pfederc::SyntaxErrorCode> *)local_80.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError((Parser *)&stack0xffffffffffffffb0,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffb0);
          if ((Error<pfederc::SyntaxErrorCode> *)local_80.line !=
              (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_80,
                       (Error<pfederc::SyntaxErrorCode> *)local_80.line);
          }
          skipToStmtEol(this);
        }
        if (local_68 != (Lexer *)0x0) {
          (*(code *)((_List_node_base *)((Expr *)&local_68->_vptr_Lexer)->_vptr_Expr)->_M_prev)();
        }
      }
      bVar11 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    } while (bVar11);
  }
  return;
}

Assistant:

void Parser::parseTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      if (!funcExpr->getTemplates().empty()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              funcExpr->getTemplates().front()->id->getPosition()
              + funcExpr->getTemplates().back()->expr->getPosition()));
      }

      if (funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_BODY,
              funcExpr->getBody()->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}